

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O3

double linalg::uangle<double,4>(vec<double,_4> *a,vec<double,_4> *b)

{
  double __x;
  double dVar1;
  
  dVar1 = b->w * a->w + b->y * a->y + b->x * a->x + 0.0 + b->z * a->z;
  if (1.0 < dVar1) {
    return 0.0;
  }
  __x = -1.0;
  if (-1.0 <= dVar1) {
    __x = dVar1;
  }
  dVar1 = acos(__x);
  return dVar1;
}

Assistant:

constexpr auto operator() (A & a) const -> decltype(a.y) { return a.y; }